

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O2

ChStreamInBinary * __thiscall chrono::ChStreamInBinary::operator>>(ChStreamInBinary *this,uint *Val)

{
  uint tmp;
  
  if ((this->super_ChBinaryArchive).big_endian_machine == true) {
    (*(this->super_ChStreamIn)._vptr_ChStreamIn[3])(this,&tmp,4);
    StreamSwapBytes<unsigned_int>(&tmp);
    *Val = tmp;
  }
  else {
    (*(this->super_ChStreamIn)._vptr_ChStreamIn[3])(this,Val,4);
  }
  return this;
}

Assistant:

ChStreamInBinary& ChStreamInBinary::operator>>(unsigned int& Val) {
    if (big_endian_machine) {
        unsigned int tmp;
        this->Input((char*)&tmp, sizeof(unsigned int));
        StreamSwapBytes<unsigned int>(&tmp);
        Val = tmp;
    } else {
        this->Input((char*)&Val, sizeof(unsigned int));
    }
    return (*this);
}